

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O0

void append_batch_delta(void)

{
  fdb_status fVar1;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char value [256];
  char key [256];
  int i;
  int start;
  int N;
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  size_t in_stack_fffffffffffffc88;
  void *in_stack_fffffffffffffc90;
  size_t keylen;
  void *in_stack_fffffffffffffca0;
  fdb_kvs_handle *in_stack_fffffffffffffca8;
  char local_278 [256];
  fdb_config *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  fdb_file_handle **in_stack_fffffffffffffe98;
  uint local_70;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  keylen = 0;
  fVar1 = fdb_open(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x227);
    append_batch_delta::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x227,"void append_batch_delta()");
    }
  }
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)
                     CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     &in_stack_fffffffffffffc68->root,(fdb_kvs_config *)0x10a505);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x229);
    append_batch_delta::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x229,"void append_batch_delta()");
    }
  }
  local_70 = 0x9c4;
  do {
    if (4999 < (int)local_70) {
      fVar1 = fdb_commit(in_stack_fffffffffffffc68,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x239);
        append_batch_delta::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x239,"void append_batch_delta()");
        }
      }
      fVar1 = fdb_close(in_stack_fffffffffffffc68);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x23c);
        append_batch_delta::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x23c,"void append_batch_delta()");
        }
      }
      return;
    }
    sprintf(&stack0xfffffffffffffe88,"key%250d",(ulong)local_70);
    sprintf(local_278,"body%250d",(ulong)local_70);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,keylen,
                       in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x231);
      append_batch_delta::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x231,"void append_batch_delta()");
      }
    }
    if ((local_70 == 0xea6) &&
       (fVar1 = fdb_commit(in_stack_fffffffffffffc68,'\0'), fVar1 != FDB_RESULT_SUCCESS)) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x234);
      append_batch_delta::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x234,"void append_batch_delta()");
      }
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

static void append_batch_delta(void)
{
    TEST_INIT();
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    int N = 5000;
    int start = N/2;
    int i;

    char key[256], value[256];
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    // open db
    status = fdb_open(&dbfile, "anomaly_test1a", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // phase 2 of compaction...
    // insert docs
    for (i=start;i<N;++i){
        sprintf(key, "key%250d", i);
        sprintf(value, "body%250d", i);
        status = fdb_set_kv(db, key, 253, value, 254);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i == start + start/2) {
            status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
}